

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O0

int BREFILL(p_ply ply)

{
  int iVar1;
  size_t __n;
  long in_RDI;
  size_t size;
  undefined8 local_18;
  undefined4 local_4;
  
  __n = *(long *)(in_RDI + 0x2060) - *(long *)(in_RDI + 0x2050);
  memmove((void *)(in_RDI + 0x4c),(void *)(in_RDI + 0x4c + *(long *)(in_RDI + 0x2050)),__n);
  *(size_t *)(in_RDI + 0x2060) = __n;
  *(undefined8 *)(in_RDI + 0x2058) = 0;
  *(undefined8 *)(in_RDI + 0x2050) = 0;
  if (*(long *)(in_RDI + 0x38) == 0) {
    iVar1 = gzread(*(undefined8 *)(in_RDI + 0x40),in_RDI + 0x4c + __n,0x1fff - (int)__n);
    local_18 = (size_t)iVar1;
  }
  else {
    local_18 = fread((void *)(in_RDI + 0x4c + __n),1,0x1fff - __n,*(FILE **)(in_RDI + 0x38));
  }
  *(undefined1 *)(in_RDI + 0x204b) = 0;
  if (local_18 != 0) {
    *(size_t *)(in_RDI + 0x2060) = local_18 + *(long *)(in_RDI + 0x2060);
  }
  local_4 = (uint)(local_18 != 0);
  return local_4;
}

Assistant:

static int BREFILL(p_ply ply) {
    /* move untouched data to beginning of buffer */
    size_t size = BSIZE(ply);
    memmove(ply->buffer, BFIRST(ply), size);
    ply->buffer_last = size;
    ply->buffer_first = ply->buffer_token = 0;
    /* fill remaining with new data */
    if (ply->fp)
        size = fread(ply->buffer + size, 1, BUFFERSIZE - size - 1, ply->fp);
    else
        size = gzread(ply->gzfp, ply->buffer + size, BUFFERSIZE - size - 1);
    /* place sentinel so we can use str* functions with buffer */
    ply->buffer[BUFFERSIZE - 1] = '\0';
    /* check if read failed */
    if (size <= 0) return 0;
    /* increase size to account for new data */
    ply->buffer_last += size;
    return 1;
}